

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O2

sensor * __thiscall ev3dev::sensor::set_mode(sensor *this,string *v)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"mode",&local_39);
  device::set_attr_string(&this->super_device,&local_38,v);
  std::__cxx11::string::~string((string *)&local_38);
  return this;
}

Assistant:

sensor& set_mode(std::string v) {
            set_attr_string("mode", v);
            return *this;
        }